

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-dark.c
# Opt level: O2

_Bool borg_flow_dark(_Bool neer)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  loc_conflict grid1;
  _Bool _Var4;
  wchar_t wVar5;
  loc_conflict grid2;
  int in_EDX;
  wchar_t wVar6;
  uint8_t *extraout_RDX;
  uint8_t *extraout_RDX_00;
  uint8_t *extraout_RDX_01;
  uint8_t *extraout_RDX_02;
  uint8_t *puVar7;
  ulong uVar8;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  int iVar9;
  int iVar10;
  char *who;
  int iVar11;
  long lVar12;
  int iVar13;
  wchar_t wVar14;
  int iVar15;
  wchar_t wVar16;
  ulong uVar17;
  
  if ((borg_morgoth_position) && (morgoth_on_level)) {
    return false;
  }
  _Var4 = borg_flow_dark_interesting(borg.c.y,borg.c.x,in_EDX);
  if (_Var4) {
    return false;
  }
  uVar8 = 0xffffffff;
  puVar7 = extraout_RDX;
  wVar6 = L'\xffffffff';
  for (uVar17 = 0; (long)uVar17 < (long)track_less.num; uVar17 = uVar17 + 1) {
    grid2 = loc(track_less.x[uVar17],track_less.y[uVar17]);
    grid1.y = borg.c.y;
    grid1.x = borg.c.x;
    wVar5 = distance(grid1,grid2);
    wVar14 = wVar6;
    if (wVar6 <= wVar5) {
      wVar14 = wVar5;
    }
    if (wVar6 < wVar5) {
      uVar8 = uVar17 & 0xffffffff;
    }
    puVar7 = extraout_RDX_00;
    wVar6 = wVar14;
  }
  iVar9 = borg.trait[0x69];
  wVar6 = (wchar_t)uVar8;
  if (neer) {
    if (iVar9 != 0) {
      borg_temp_n = 0;
      for (lVar12 = 0; lVar12 < borg_light_n; lVar12 = lVar12 + 1) {
        bVar2 = borg_light_y[lVar12];
        bVar3 = borg_light_x[lVar12];
        _Var4 = borg_flow_dark_interesting((uint)bVar2,(uint)bVar3,(int)puVar7);
        puVar7 = extraout_RDX_01;
        if ((_Var4) &&
           (_Var4 = borg_flow_far_from_stairs((uint)bVar3,(uint)bVar2,wVar6),
           puVar7 = extraout_RDX_02, !_Var4)) {
          borg_temp_x[borg_temp_n] = bVar3;
          puVar7 = borg_temp_y;
          borg_temp_y[borg_temp_n] = bVar2;
          borg_temp_n = borg_temp_n + 1;
        }
      }
      if (borg_temp_n != 0) {
        if ((borg.goal.ignoring != false) || (scaryguy_on_level == true)) {
          borg_danger_wipe = true;
        }
        borg_flow_clear();
        for (lVar12 = 0; lVar12 < borg_temp_n; lVar12 = lVar12 + 1) {
          borg_flow_direct((uint)borg_temp_y[lVar12],(uint)borg_temp_x[lVar12]);
        }
        _Var4 = borg_flow_commit((char *)0x0,L'\x04');
        if ((_Var4) && (_Var4 = borg_flow_old(L'\x04'), _Var4)) {
          return true;
        }
      }
    }
    if (borg.trait[0x69] != 0) {
      iVar9 = borg.trait[0x1a];
      borg_temp_n = 0;
      for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
        iVar13 = (int)ddy_ddd[lVar12] * (iVar9 + 1);
        if ((0xffffffbf < (iVar13 + borg.c.y) - 0x41U) &&
           (iVar15 = (int)ddx_ddd[lVar12] * (iVar9 + 1), 0xffffff3b < (iVar15 + borg.c.x) - 0xc5U))
        {
          wVar14 = iVar13 + borg.c.y;
          wVar5 = iVar15 + borg.c.x;
          if ((borg_grids[(uint)wVar14][(uint)wVar5].feat == '\0') &&
             (((borg_grids[(uint)wVar14][(uint)wVar5].info & 0x20) != 0 &&
              (_Var4 = borg_flow_far_from_stairs(wVar5,wVar14,wVar6), !_Var4)))) {
            borg_temp_x[borg_temp_n] = (uint8_t)wVar5;
            borg_temp_y[borg_temp_n] = (uint8_t)wVar14;
            borg_temp_n = borg_temp_n + 1;
          }
        }
      }
      if (borg_temp_n != 0) {
        if ((borg.goal.ignoring != false) || (scaryguy_on_level == true)) {
          borg_danger_wipe = true;
        }
        borg_flow_clear();
        for (lVar12 = 0; lVar12 < borg_temp_n; lVar12 = lVar12 + 1) {
          borg_flow_direct((uint)borg_temp_y[lVar12],(uint)borg_temp_x[lVar12]);
        }
        _Var4 = borg_flow_commit((char *)0x0,L'\x04');
        if ((_Var4) && (_Var4 = borg_flow_old(L'\x04'), _Var4)) {
          return true;
        }
      }
    }
    if (borg.trait[0x69] == 0) {
      return false;
    }
    iVar9 = 5;
    if (5 < borg.c.y) {
      iVar9 = borg.c.y;
    }
    wVar14 = iVar9 + L'\xfffffffc';
    iVar9 = 5;
    if (5 < borg.c.x) {
      iVar9 = borg.c.x;
    }
    iVar13 = 0x3c;
    if (borg.c.y < 0x3c) {
      iVar13 = borg.c.y;
    }
    uVar8 = (ulong)(uint)(iVar13 + L'\x04');
    iVar15 = 0xc0;
    if (borg.c.x < 0xc0) {
      iVar15 = borg.c.x;
    }
    borg_temp_n = 0;
    for (; wVar5 = iVar9 + L'\xfffffffc', wVar14 <= iVar13 + L'\x04'; wVar14 = wVar14 + L'\x01') {
      for (; wVar5 <= iVar15 + L'\x04'; wVar5 = wVar5 + L'\x01') {
        _Var4 = borg_flow_dark_interesting(wVar14,wVar5,(int)uVar8);
        uVar8 = extraout_RDX_06;
        if (((_Var4) &&
            (_Var4 = borg_flow_dark_reachable(wVar14,wVar5), uVar8 = extraout_RDX_07, _Var4)) &&
           (_Var4 = borg_flow_far_from_stairs(wVar5,wVar14,wVar6), uVar8 = extraout_RDX_08, !_Var4))
        {
          borg_temp_x[borg_temp_n] = (uint8_t)wVar5;
          borg_temp_y[borg_temp_n] = (uint8_t)wVar14;
          borg_temp_n = borg_temp_n + 1;
        }
      }
    }
    if (borg_temp_n == 0) {
      return false;
    }
    if ((borg.goal.ignoring != false) || (scaryguy_on_level == true)) {
      borg_danger_wipe = true;
    }
    borg_flow_clear();
    for (lVar12 = 0; lVar12 < borg_temp_n; lVar12 = lVar12 + 1) {
      borg_flow_enqueue_grid((uint)borg_temp_y[lVar12],(uint)borg_temp_x[lVar12]);
    }
    borg_flow_spread(L'\x05',false,true,false,L'\xffffffff',false);
    who = (char *)0x0;
    goto LAB_002058f7;
  }
  if ((iVar9 != 0) && (vault_on_level == false)) {
    iVar13 = 0xc;
    if (0xc < borg.c.y) {
      iVar13 = borg.c.y;
    }
    wVar14 = iVar13 + L'\xfffffff5';
    iVar15 = 0xc;
    if (0xc < borg.c.x) {
      iVar15 = borg.c.x;
    }
    iVar11 = 0x35;
    if (borg.c.y < 0x35) {
      iVar11 = borg.c.y;
    }
    iVar10 = 0xb9;
    if (borg.c.x < 0xb9) {
      iVar10 = borg.c.x;
    }
    borg_temp_n = 0;
    uVar1 = borg.trait[0x23] - 5;
    uVar8 = (ulong)uVar1;
    wVar5 = L'ú';
    if ((int)uVar1 <= iVar9) {
      wVar5 = borg.trait[0x23] * 3 + L'\t';
    }
    for (; wVar16 = iVar15 + L'\xfffffff5', wVar14 <= iVar11 + L'\v'; wVar14 = wVar14 + L'\x01') {
      for (; wVar16 <= iVar10 + L'\v'; wVar16 = wVar16 + L'\x01') {
        _Var4 = borg_flow_dark_interesting(wVar14,wVar16,(int)uVar8);
        uVar8 = extraout_RDX_03;
        if (((_Var4) &&
            (_Var4 = borg_flow_dark_reachable(wVar14,wVar16), uVar8 = extraout_RDX_04, _Var4)) &&
           (_Var4 = borg_flow_far_from_stairs_dist(wVar16,wVar14,wVar6,wVar5),
           uVar8 = extraout_RDX_05, !_Var4)) {
          borg_temp_x[borg_temp_n] = (uint8_t)wVar16;
          borg_temp_y[borg_temp_n] = (uint8_t)wVar14;
          borg_temp_n = borg_temp_n + 1;
        }
      }
    }
    if (borg_temp_n != 0) {
      if ((borg.goal.ignoring != false) || (scaryguy_on_level == true)) {
        borg_danger_wipe = true;
      }
      borg_flow_clear();
      for (lVar12 = 0; lVar12 < borg_temp_n; lVar12 = lVar12 + 1) {
        borg_flow_enqueue_grid((uint)borg_temp_y[lVar12],(uint)borg_temp_x[lVar12]);
      }
      borg_flow_border(iVar13 + -0xc,iVar15 + -0xc,iVar11 + 0xc,iVar10 + 0xc,true);
      wVar14 = L'ú';
      if (borg.trait[0x23] < 0xf) {
        wVar14 = wVar5;
      }
      borg_flow_spread(wVar14,true,true,false,L'\xffffffff',false);
      borg_flow_border(iVar13 + -0xc,iVar15 + -0xc,iVar11 + 0xc,iVar10 + 0xc,false);
      _Var4 = borg_flow_commit("dark-4",L'\x04');
      if ((_Var4) && (_Var4 = borg_flow_old(L'\x04'), _Var4)) {
        return true;
      }
    }
  }
  if (borg.trait[0x69] == 0) {
    return false;
  }
  borg_temp_n = 0;
  wVar14 = L'\x01';
  uVar1 = borg.trait[0x23] - 5;
  uVar8 = (ulong)uVar1;
  wVar5 = L'ú';
  if ((int)uVar1 <= borg.trait[0x69]) {
    wVar5 = borg.trait[0x23] * 3 + L'\t';
  }
  for (; wVar14 < L'A'; wVar14 = wVar14 + L'\x01') {
    for (wVar16 = L'\x01'; wVar16 != L'Å'; wVar16 = wVar16 + L'\x01') {
      _Var4 = borg_flow_dark_interesting(wVar14,wVar16,(int)uVar8);
      uVar8 = extraout_RDX_09;
      if (((_Var4) &&
          (_Var4 = borg_flow_dark_reachable(wVar14,wVar16), uVar8 = extraout_RDX_10, _Var4)) &&
         (_Var4 = borg_flow_far_from_stairs_dist(wVar16,wVar14,wVar6,wVar5), uVar8 = extraout_RDX_11
         , !_Var4)) {
        borg_temp_x[borg_temp_n] = (uint8_t)wVar16;
        borg_temp_y[borg_temp_n] = (uint8_t)wVar14;
        borg_temp_n = borg_temp_n + 1;
        if (borg_temp_n == 9000) {
          wVar14 = L'B';
          break;
        }
      }
    }
  }
  if (borg_temp_n == 0) {
    return false;
  }
  if ((borg.goal.ignoring != false) || (scaryguy_on_level == true)) {
    borg_danger_wipe = true;
  }
  borg_flow_clear();
  for (lVar12 = 0; lVar12 < borg_temp_n; lVar12 = lVar12 + 1) {
    borg_flow_enqueue_grid((uint)borg_temp_y[lVar12],(uint)borg_temp_x[lVar12]);
  }
  if (borg.trait[0x23] < 6) {
    iVar9 = borg.trait[0x1b];
    if (iVar9 < avoidance) {
LAB_002058cf:
      if (iVar9 < avoidance) goto LAB_002058d3;
    }
  }
  else {
    if ((uint)borg.trait[0x23] < 0x1f) {
      iVar9 = borg.trait[0x1b];
      goto LAB_002058cf;
    }
LAB_002058d3:
    wVar5 = L'ú';
  }
  borg_flow_spread(wVar5,true,true,false,L'\xffffffff',false);
  who = "dark-5";
LAB_002058f7:
  _Var4 = borg_flow_commit(who,L'\x04');
  if ((_Var4) && (_Var4 = borg_flow_old(L'\x04'), _Var4)) {
    return true;
  }
  return false;
}

Assistant:

bool borg_flow_dark(bool neer)
{
    int i;
    int x, y, j, b_j = -1;
    int b_stair = -1;

    /* Not if sitting in a sea of runes and we saw Morgoth recently */
    if (borg_morgoth_position && morgoth_on_level)
        return false;

    /* Paranoia */
    if (borg_flow_dark_interesting(borg.c.y, borg.c.x, -1)) {
        return false;
    }

    /* Check distance away from stairs, used later */
    /* Check for an existing "up stairs" */
    for (i = 0; i < track_less.num; i++) {
        x = track_less.x[i];
        y = track_less.y[i];

        /* How far is the nearest up stairs */
        j = distance(borg.c, loc(x, y));

        /* skip the closer ones */
        if (b_j >= j)
            continue;

        /* track it */
        b_j     = j;
        b_stair = i;
    }

    /* Near */
    if (neer) {
        /* Method 1 */
        if (borg_flow_dark_1(b_stair))
            return true;

        /* Method 2 */
        if (borg_flow_dark_2(b_stair))
            return true;

        /* Method 3 */
        if (borg_flow_dark_3(b_stair))
            return true;
    }
    /* Far */
    else {
        /* Method 4 */
        if (borg_flow_dark_4(b_stair))
            return true;

        /* Method 5 */
        if (borg_flow_dark_5(b_stair))
            return true;
    }

    /* Fail */
    return false;
}